

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_canbus.cc
# Opt level: O3

int __thiscall ccel::canbus::canbus_handler::open(canbus_handler *this,char *__file,int __oflag,...)

{
  char *pcVar1;
  logic_error *this_00;
  native_handle_type __tmp_sock_holder;
  error_code __tmp_ec_holder;
  native_handle_type local_34;
  error_code local_30;
  
  local_34 = open_cansock(__file,1);
  local_30.m_val = 0;
  local_30.m_cat = boost::system::system_category();
  boost::asio::posix::descriptor::assign(&(this->_stream).super_descriptor,&local_34,&local_30);
  if (local_30.m_val == 0) {
    (this->super_base_handler)._open = true;
    pcVar1 = (char *)(this->_interface_name)._M_string_length;
    strlen(__file);
    std::__cxx11::string::_M_replace((ulong)&this->_interface_name,0,pcVar1,(ulong)__file);
    return 0;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"[CANBUS_Handler]boost_basic_stream assign error happend.");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int canbus_handler::open(const char *interface_name) {
  try {
    auto __tmp_sock_holder = open_cansock(interface_name);
    boost::system::error_code __tmp_ec_holder;
    _stream.assign(__tmp_sock_holder, __tmp_ec_holder);
    if (__tmp_ec_holder)
      throw std::logic_error(
          "[CANBUS_Handler]boost_basic_stream assign error happend.");
    _open = true;
    _interface_name = interface_name;
    return 0;
  } catch (std::runtime_error &_e) {
    return -1;
  } catch (...) {
    throw;
  }
}